

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_rnglists.c
# Opt level: O1

int dwarf_load_rnglists(Dwarf_Debug dbg,Dwarf_Unsigned *rnglists_count,Dwarf_Error *error)

{
  Dwarf_Chain pDVar1;
  bool bVar2;
  int iVar3;
  Dwarf_Rnglists_Context buildhere;
  char *pcVar4;
  Dwarf_Rnglists_Context *ppDVar5;
  Dwarf_Small *data;
  Dwarf_Unsigned DVar6;
  Dwarf_Chain space;
  Dwarf_Unsigned contextnum;
  Dwarf_Chain local_68;
  Dwarf_Unsigned nextoffset;
  char *local_58;
  Dwarf_Unsigned local_50;
  Dwarf_Small *local_48;
  Dwarf_Unsigned *local_40;
  Dwarf_Small *local_38;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_load_rnglistseither null or it containsa stale Dwarf_Debug pointer"
                       );
    iVar3 = 1;
  }
  else if (dbg->de_rnglists_context == (Dwarf_Rnglists_Context *)0x0) {
    if ((dbg->de_debug_rnglists).dss_size == 0) {
      iVar3 = -1;
    }
    else {
      local_40 = rnglists_count;
      if (((dbg->de_debug_rnglists).dss_data != (Dwarf_Small *)0x0) ||
         (iVar3 = _dwarf_load_section(dbg,&dbg->de_debug_rnglists,error), iVar3 == 0)) {
        contextnum = 0;
        nextoffset = 0;
        data = (dbg->de_debug_rnglists).dss_data;
        DVar6 = (dbg->de_debug_rnglists).dss_size;
        local_68 = (Dwarf_Chain)0x0;
        local_48 = data;
        if (0 < (long)DVar6) {
          local_38 = data + DVar6;
          local_50 = 0;
          contextnum = 0;
          local_58 = (char *)&local_68;
          do {
            buildhere = (Dwarf_Rnglists_Context)malloc(0x88);
            if (buildhere == (Dwarf_Rnglists_Context)0x0) {
              free_rnglists_chain(dbg,local_68);
              _dwarf_error_string(dbg,error,0x3e,
                                  "DW_DLE_ALLOC_FAIL: Allocation of Rnglists_Context failed");
              bVar2 = false;
            }
            else {
              memset(buildhere,0,0x88);
              buildhere->rc_magic = 0xabcd;
              iVar3 = _dwarf_internal_read_rnglists_header
                                (dbg,1,contextnum,DVar6,data,local_38,local_50,buildhere,&nextoffset
                                 ,error);
              if (iVar3 != 1) {
                buildhere->rc_magic = 0xabcd;
                pcVar4 = _dwarf_get_alloc(dbg,'\x1f',1);
                if (pcVar4 != (char *)0x0) {
                  *(Dwarf_Rnglists_Context *)pcVar4 = buildhere;
                  contextnum = contextnum + 1;
                  *(char **)local_58 = pcVar4;
                  local_58 = pcVar4 + 0x10;
                  bVar2 = true;
                  local_50 = nextoffset;
                  goto LAB_001c760f;
                }
                _dwarf_error_string(dbg,error,0x3e,
                                    "DW_DLE_ALLOC_FAIL: allocating Rnglists_Context chain entry");
              }
              free(buildhere->rc_offset_value_array);
              bVar2 = false;
              buildhere->rc_offset_value_array = (Dwarf_Unsigned *)0x0;
              buildhere->rc_magic = 0;
              free(buildhere);
              free_rnglists_chain(dbg,local_68);
            }
LAB_001c760f:
            if (!bVar2) {
              bVar2 = true;
              contextnum = 0;
              ppDVar5 = (Dwarf_Rnglists_Context *)0x0;
              goto LAB_001c76d4;
            }
            data = local_48 + nextoffset;
          } while ((long)nextoffset < (long)DVar6);
        }
        ppDVar5 = (Dwarf_Rnglists_Context *)malloc(contextnum * 8);
        if (ppDVar5 == (Dwarf_Rnglists_Context *)0x0) {
          free_rnglists_chain(dbg,local_68);
          _dwarf_error_string(dbg,error,0x3e,"Allocation of Rnglists_Context pointer array failed");
          bVar2 = true;
          ppDVar5 = (Dwarf_Rnglists_Context *)0x0;
          contextnum = 0;
        }
        else {
          if (contextnum != 0) {
            DVar6 = 0;
            space = local_68;
            do {
              ppDVar5[DVar6] = (Dwarf_Rnglists_Context)space->ch_item;
              space->ch_item = (void *)0x0;
              pDVar1 = space->ch_next;
              dwarf_dealloc(dbg,space,0x1f);
              DVar6 = DVar6 + 1;
              space = pDVar1;
            } while (contextnum != DVar6);
          }
          bVar2 = false;
        }
LAB_001c76d4:
        iVar3 = 1;
        if (!bVar2) {
          dbg->de_rnglists_context = ppDVar5;
          dbg->de_rnglists_context_count = contextnum;
          iVar3 = 0;
          if (local_40 != (Dwarf_Unsigned *)0x0) {
            *local_40 = contextnum;
          }
        }
      }
    }
  }
  else {
    iVar3 = 0;
    if (rnglists_count != (Dwarf_Unsigned *)0x0) {
      *rnglists_count = dbg->de_rnglists_context_count;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int dwarf_load_rnglists(
    Dwarf_Debug dbg,
    Dwarf_Unsigned *rnglists_count,
    Dwarf_Error *error)
{
    int res = DW_DLV_ERROR;
    Dwarf_Rnglists_Context *cxt = 0;
    Dwarf_Unsigned count = 0;

    CHECK_DBG(dbg,error,"dwarf_load_rnglists");
    if (dbg->de_rnglists_context) {
        if (rnglists_count) {
            *rnglists_count = dbg->de_rnglists_context_count;
        }
        return DW_DLV_OK;
    }
    if (!dbg->de_debug_rnglists.dss_size) {
        /* nothing there. */
        return DW_DLV_NO_ENTRY;
    }
    if (!dbg->de_debug_rnglists.dss_data) {
        res = _dwarf_load_section(dbg, &dbg->de_debug_rnglists,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
    }
    res = internal_load_rnglists_contexts(dbg,&cxt,&count,error);
    if (res == DW_DLV_ERROR) {
        return res;
    }
    dbg->de_rnglists_context = cxt;
    dbg->de_rnglists_context_count = count;
    if (rnglists_count) {
        *rnglists_count = count;
    }
    return DW_DLV_OK;
}